

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_buildBlockEntropyStats
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,
                 ZSTD_entropyCTablesMetadata_t *entropyMetadata,void *workspace,size_t wkspSize)

{
  void *workSpace;
  ZSTD_strategy ZVar1;
  BYTE *source;
  BYTE *pBVar2;
  U32 maxSymbolValue;
  int iVar3;
  HUF_repeat HVar4;
  uint maxNbBits;
  size_t err_code_2;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  ulong sourceSize;
  size_t err_code;
  symbolEncodingType_e sVar10;
  undefined8 uVar11;
  ZSTD_symbolEncodingTypeStats_t local_58;
  
  source = seqStorePtr->litStart;
  pBVar2 = seqStorePtr->lit;
  ZVar1 = (cctxParams->cParams).strategy;
  iVar3 = ZSTD_literalsCompressionIsDisabled(cctxParams);
  local_58.LLtype = 0xff;
  HVar4 = (prevEntropy->huf).repeatMode;
  memcpy(nextEntropy,prevEntropy,0x810);
  sVar10 = set_basic;
  if (iVar3 == 0) {
    sourceSize = (long)pBVar2 - (long)source;
    uVar8 = 0x3f;
    if ((prevEntropy->huf).repeatMode == HUF_repeat_valid) {
      uVar8 = 6;
    }
    if (sourceSize <= uVar8) goto LAB_00174051;
    sVar5 = HIST_count_wksp((uint *)workspace,&local_58.LLtype,source,sourceSize,workspace,wkspSize)
    ;
    maxSymbolValue = local_58.LLtype;
    if (0xffffffffffffff88 < sVar5) {
LAB_001742cb:
      (entropyMetadata->hufMetadata).hufDesSize = sVar5;
      return sVar5;
    }
    if (sVar5 == sourceSize) {
      sVar10 = set_rle;
      goto LAB_00174051;
    }
    if (sVar5 <= (sourceSize >> 7) + 4) goto LAB_00174051;
    workSpace = (void *)((long)workspace + 0x400);
    sVar7 = wkspSize - 0x400;
    if (HVar4 == HUF_repeat_check) {
      HVar4 = HUF_validateCTable((HUF_CElt *)prevEntropy,(uint *)workspace,local_58.LLtype);
    }
    memset(nextEntropy,0,0x808);
    maxNbBits = HUF_optimalTableLog(0xb,sourceSize,maxSymbolValue,workSpace,sVar7,
                                    (HUF_CElt *)nextEntropy,(uint *)workspace,
                                    (uint)(ZSTD_btopt < ZVar1) * 2);
    if (0xb < maxNbBits) {
      __assert_fail("huffLog <= LitHufLog",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5e8e,
                    "size_t ZSTD_buildBlockEntropyStats_literals(void *const, size_t, const ZSTD_hufCTables_t *, ZSTD_hufCTables_t *, ZSTD_hufCTablesMetadata_t *, const int, void *, size_t, int)"
                   );
    }
    sVar5 = HUF_buildCTable_wksp
                      ((HUF_CElt *)nextEntropy,(uint *)workspace,maxSymbolValue,maxNbBits,workSpace,
                       sVar7);
    if (0xffffffffffffff88 < sVar5) goto LAB_001742cb;
    sVar6 = HUF_estimateCompressedSize((HUF_CElt *)nextEntropy,(uint *)workspace,maxSymbolValue);
    sVar5 = HUF_writeCTable_wksp
                      ((entropyMetadata->hufMetadata).hufDesBuffer,0x80,(HUF_CElt *)nextEntropy,
                       maxSymbolValue,(uint)sVar5,workSpace,sVar7);
    if (((HVar4 != HUF_repeat_none) &&
        (sVar7 = HUF_estimateCompressedSize
                           ((HUF_CElt *)prevEntropy,(uint *)workspace,maxSymbolValue),
        sVar7 < sourceSize)) && (sourceSize <= sVar5 + 0xc || sVar7 <= sVar5 + sVar6)) {
      sVar10 = set_repeat;
LAB_001742db:
      memcpy(nextEntropy,prevEntropy,0x810);
      goto LAB_00174051;
    }
    sVar10 = set_basic;
    if (sourceSize <= sVar6 + sVar5) goto LAB_001742db;
    (entropyMetadata->hufMetadata).hType = set_compressed;
    (nextEntropy->huf).repeatMode = HUF_repeat_check;
    (entropyMetadata->hufMetadata).hufDesSize = sVar5;
    if (0xffffffffffffff88 < sVar5) {
      return sVar5;
    }
  }
  else {
LAB_00174051:
    (entropyMetadata->hufMetadata).hType = sVar10;
    (entropyMetadata->hufMetadata).hufDesSize = 0;
  }
  lVar9 = (long)seqStorePtr->sequences - (long)seqStorePtr->sequencesStart;
  if (lVar9 == 0) {
    (nextEntropy->fse).litlength_repeatMode = FSE_repeat_none;
    (nextEntropy->fse).offcode_repeatMode = FSE_repeat_none;
    (nextEntropy->fse).matchlength_repeatMode = FSE_repeat_none;
    uVar11 = 0;
    local_58.MLtype = set_basic;
    local_58.size = 0;
    local_58.lastCountSize = 0;
  }
  else {
    ZSTD_buildSequencesStatistics
              (&local_58,seqStorePtr,lVar9 >> 3,&prevEntropy->fse,&nextEntropy->fse,
               (entropyMetadata->fseMetadata).fseTablesBuffer,
               &(entropyMetadata->fseMetadata).field_0x91,(cctxParams->cParams).strategy,
               (uint *)workspace,(void *)((long)workspace + 0xd4),wkspSize - 0xd4);
    if (0xffffffffffffff88 < local_58.size) goto LAB_0017411c;
    uVar11 = CONCAT44(local_58.Offtype,local_58.LLtype);
  }
  (entropyMetadata->fseMetadata).llType = (int)uVar11;
  (entropyMetadata->fseMetadata).ofType = (int)((ulong)uVar11 >> 0x20);
  (entropyMetadata->fseMetadata).mlType = local_58.MLtype;
  (entropyMetadata->fseMetadata).lastCountSize = local_58.lastCountSize;
LAB_0017411c:
  (entropyMetadata->fseMetadata).fseTablesSize = local_58.size;
  uVar8 = 0;
  if (0xffffffffffffff88 < local_58.size) {
    uVar8 = local_58.size;
  }
  return uVar8;
}

Assistant:

size_t ZSTD_buildBlockEntropyStats(
            const seqStore_t* seqStorePtr,
            const ZSTD_entropyCTables_t* prevEntropy,
                  ZSTD_entropyCTables_t* nextEntropy,
            const ZSTD_CCtx_params* cctxParams,
                  ZSTD_entropyCTablesMetadata_t* entropyMetadata,
                  void* workspace, size_t wkspSize)
{
    size_t const litSize = (size_t)(seqStorePtr->lit - seqStorePtr->litStart);
    int const huf_useOptDepth = (cctxParams->cParams.strategy >= HUF_OPTIMAL_DEPTH_THRESHOLD);
    int const hufFlags = huf_useOptDepth ? HUF_flags_optimalDepth : 0;

    entropyMetadata->hufMetadata.hufDesSize =
        ZSTD_buildBlockEntropyStats_literals(seqStorePtr->litStart, litSize,
                                            &prevEntropy->huf, &nextEntropy->huf,
                                            &entropyMetadata->hufMetadata,
                                            ZSTD_literalsCompressionIsDisabled(cctxParams),
                                            workspace, wkspSize, hufFlags);

    FORWARD_IF_ERROR(entropyMetadata->hufMetadata.hufDesSize, "ZSTD_buildBlockEntropyStats_literals failed");
    entropyMetadata->fseMetadata.fseTablesSize =
        ZSTD_buildBlockEntropyStats_sequences(seqStorePtr,
                                              &prevEntropy->fse, &nextEntropy->fse,
                                              cctxParams,
                                              &entropyMetadata->fseMetadata,
                                              workspace, wkspSize);
    FORWARD_IF_ERROR(entropyMetadata->fseMetadata.fseTablesSize, "ZSTD_buildBlockEntropyStats_sequences failed");
    return 0;
}